

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farmhash-c.c
# Opt level: O2

uint64_t farmhash_na_len_17_to_32(char *s,size_t len)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  lVar1 = len * 2 + -0x651e95c4d06fbfb1;
  uVar3 = *(long *)(s + (len - 8)) * lVar1;
  uVar4 = *(long *)s * -0x4b6d499041670d8d + *(long *)(s + 8);
  uVar2 = *(long *)(s + 8) + 0x9ae16a3b2f90404f;
  uVar2 = (uVar2 >> 0x12 | uVar2 << 0x2e) + *(long *)s * -0x4b6d499041670d8d + uVar3;
  uVar4 = ((uVar3 >> 0x1e | uVar3 << 0x22) + (uVar4 >> 0x2b | uVar4 * 0x200000) +
           *(long *)(s + (len - 0x10)) * -0x651e95c4d06fbfb1 ^ uVar2) * lVar1;
  uVar4 = (uVar4 >> 0x2f ^ uVar2 ^ uVar4) * lVar1;
  return (uVar4 >> 0x2f ^ uVar4) * lVar1;
}

Assistant:

static inline uint64_t farmhash_na_len_17_to_32(const char *s, size_t len) {
  uint64_t mul = k2 + len * 2;
  uint64_t a = fetch64(s) * k1;
  uint64_t b = fetch64(s + 8);
  uint64_t c = fetch64(s + len - 8) * mul;
  uint64_t d = fetch64(s + len - 16) * k2;
  return farmhash_len_16_mul(ror64(a + b, 43) + ror64(c, 30) + d,
                   a + ror64(b + k2, 18) + c, mul);
}